

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O1

void slang::ast::AssertionPortSymbol::buildPorts
               (Scope *scope,AssertionItemPortListSyntax *syntax,
               SmallVectorBase<const_slang::ast::AssertionPortSymbol_*> *results)

{
  SymbolKind SVar1;
  SyntaxKind SVar2;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar3;
  DeclaredType *pDVar4;
  SyntaxNode *pSVar5;
  Type *arg;
  ArgumentDirection AVar6;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar7;
  _Optional_payload_base<slang::ast::ArgumentDirection> _Var8;
  Diagnostic *pDVar9;
  SyntaxNode *pSVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  _Optional_payload_base<slang::ast::ArgumentDirection> _Var14;
  SourceRange SVar15;
  string_view arg_00;
  AssertionPortSymbol *port;
  SourceLocation local_78;
  SyntaxNode *local_70;
  Type *local_68;
  Scope *local_60;
  Token local_58;
  Compilation *local_48;
  AssertionItemPortListSyntax *local_40;
  SmallVectorBase<const_slang::ast::AssertionPortSymbol_*> *local_38;
  
  local_48 = scope->compilation;
  SVar1 = scope->thisSym->kind;
  local_38 = results;
  local_68 = Compilation::getType(local_48,Untyped);
  uVar13 = (syntax->ports).elements._M_extent._M_extent_value + 1;
  if (1 < uVar13) {
    uVar13 = uVar13 >> 1;
    lVar12 = 0;
    local_70 = (SyntaxNode *)0x0;
    uVar11 = 0;
    _Var14._M_payload = (_Storage<slang::ast::ArgumentDirection,_true>)0x0;
    _Var14._M_engaged = false;
    _Var14._5_3_ = 0;
    local_60 = scope;
    local_40 = syntax;
    do {
      ppSVar7 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((long)&(((local_40->ports).elements._M_ptr)->super_ConstTokenOrSyntax).
                                   super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                           + lVar12));
      pSVar3 = *ppSVar7;
      if (pSVar3->previewNode != (SyntaxNode *)0x0) {
        Scope::addMembers(scope,pSVar3->previewNode);
      }
      local_58 = (Token)parsing::Token::valueText((Token *)(pSVar3 + 5));
      scope = local_60;
      local_78 = parsing::Token::location((Token *)(pSVar3 + 5));
      local_78 = (SourceLocation)
                 BumpAllocator::
                 emplace<slang::ast::AssertionPortSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                           (&local_48->super_BumpAllocator,
                            (basic_string_view<char,_std::char_traits<char>_> *)&local_58,&local_78)
      ;
      *(variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *)((long)local_78 + 0x38) =
           pSVar3;
      Symbol::setAttributes
                ((Symbol *)local_78,scope,
                 *(span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                   *)&pSVar3[2].previewNode);
      if (pSVar3[7].previewNode != (SyntaxNode *)0x0) {
        DeclaredType::setDimensionSyntax
                  ((DeclaredType *)((long)local_78 + 0x40),
                   (SyntaxList<slang::syntax::VariableDimensionSyntax> *)&pSVar3[5].previewNode);
      }
      arg = local_68;
      if (pSVar3[3].previewNode == (SyntaxNode *)0x0) {
        pSVar5 = pSVar3[4].previewNode;
        pSVar10 = local_70;
        if (((pSVar5->kind == ImplicitType) && (pSVar5[1].parent == (SyntaxNode *)0x0)) &&
           (pSVar5[3].previewNode == (SyntaxNode *)0x0)) {
          (((optional<slang::ast::ArgumentDirection> *)((long)local_78 + 0x88))->
          super__Optional_base<slang::ast::ArgumentDirection,_true,_true>)._M_payload.
          super__Optional_payload_base<slang::ast::ArgumentDirection> =
               (_Optional_payload_base<slang::ast::ArgumentDirection>)
               ((ulong)_Var14 & 0xffffffffff | uVar11);
        }
      }
      else {
        _Var8._M_payload = (_Storage<slang::ast::ArgumentDirection,_true>)0x0;
        _Var8._M_engaged = true;
        _Var8._5_3_ = 0;
        if (pSVar3[4].parent != (SyntaxNode *)0x0) {
          AVar6 = SemanticFacts::getDirection((TokenKind)pSVar3[4].kind);
          _Var8 = (_Optional_payload_base<slang::ast::ArgumentDirection>)
                  ((ulong)AVar6 | 0x100000000);
        }
        *(_Optional_payload_base<slang::ast::ArgumentDirection> *)((long)local_78 + 0x88) = _Var8;
        pSVar10 = (SyntaxNode *)0x0;
      }
      if (*(bool *)((long)local_78 + 0x8c) == true) {
        *(byte *)((long)local_78 + 0x79) = *(byte *)((long)local_78 + 0x79) | 0x20;
      }
      pDVar4 = (DeclaredType *)pSVar3[4].previewNode;
      if (((*(SyntaxKind *)&pDVar4->parent == ImplicitType) &&
          (pDVar4->initializer == (Expression *)0x0)) &&
         (pDVar4[1].dimensions == (SyntaxList<slang::syntax::VariableDimensionSyntax> *)0x0)) {
        if (pSVar10 == (SyntaxNode *)0x0) {
          *(Type **)((long)local_78 + 0x48) = arg;
          if (pSVar3[7].previewNode != (SyntaxNode *)0x0) {
            SVar15 = slang::syntax::SyntaxNode::sourceRange(pSVar3 + 6);
            pDVar9 = Scope::addDiag(scope,(DiagCode)0xb0009,SVar15);
            ast::operator<<(pDVar9,arg);
          }
          if (pSVar3[3].previewNode != (SyntaxNode *)0x0 && SVar1 != LetDecl) {
            SVar15 = parsing::Token::range((Token *)&pSVar3[3].parent);
            Scope::addDiag(scope,(DiagCode)0x6b0006,SVar15);
          }
          local_70 = (SyntaxNode *)0x0;
        }
        else {
          ((anon_union_8_2_f12d5f64_for_typeOrLink *)((long)local_78 + 0x50))->typeSyntax =
               (DataTypeSyntax *)pSVar10;
          *(byte *)((long)local_78 + 0x7f) = *(byte *)((long)local_78 + 0x7f) & 0x7f;
          local_70 = pSVar10;
        }
      }
      else {
        ((anon_union_8_2_f12d5f64_for_typeOrLink *)((long)local_78 + 0x50))->link = pDVar4;
        *(byte *)((long)local_78 + 0x7f) = *(byte *)((long)local_78 + 0x7f) & 0x7f;
        local_70 = pSVar3[4].previewNode;
        SVar2 = local_70->kind;
        if (SVar2 == PropertyType && SVar1 == Sequence) {
          SVar15 = slang::syntax::SyntaxNode::sourceRange(local_70);
          Scope::addDiag(scope,(DiagCode)0xb10006,SVar15);
        }
        else if ((SVar2 == SequenceType || SVar2 == PropertyType) && SVar1 == LetDecl) {
          SVar15 = slang::syntax::SyntaxNode::sourceRange(local_70);
          pDVar9 = Scope::addDiag(scope,(DiagCode)0xb00006,SVar15);
          local_58 = slang::syntax::SyntaxNode::getFirstToken(pSVar3[4].previewNode);
          arg_00 = parsing::Token::valueText(&local_58);
          scope = local_60;
          Diagnostic::operator<<(pDVar9,arg_00);
        }
      }
      _Var14 = *(_Optional_payload_base<slang::ast::ArgumentDirection> *)((long)local_78 + 0x88);
      if (*(long *)(pSVar3 + 8) != 0) {
        pSVar5 = *(SyntaxNode **)(*(long *)(pSVar3 + 8) + 0x28);
        if ((*(bool *)((long)local_78 + 0x8c) == true) &&
           ((((optional<slang::ast::ArgumentDirection> *)((long)local_78 + 0x88))->
            super__Optional_base<slang::ast::ArgumentDirection,_true,_true>)._M_payload.
            super__Optional_payload_base<slang::ast::ArgumentDirection>._M_payload._M_value - Out <
            2)) {
          SVar15 = slang::syntax::SyntaxNode::sourceRange(pSVar5);
          Scope::addDiag(scope,(DiagCode)0x20006,SVar15);
        }
        else {
          *(SyntaxNode **)((long)local_78 + 0x80) = pSVar5;
        }
      }
      uVar11 = (ulong)_Var14 & 0xffffff0000000000;
      Scope::insertMember(scope,(Symbol *)local_78,scope->lastMember,false,true);
      SmallVectorBase<slang::ast::AssertionPortSymbol_const*>::
      emplace_back<slang::ast::AssertionPortSymbol_const*const&>
                ((SmallVectorBase<slang::ast::AssertionPortSymbol_const*> *)local_38,
                 (AssertionPortSymbol **)&local_78);
      lVar12 = lVar12 + 0x30;
      uVar13 = uVar13 - 1;
    } while (uVar13 != 0);
  }
  return;
}

Assistant:

void AssertionPortSymbol::buildPorts(Scope& scope, const AssertionItemPortListSyntax& syntax,
                                     SmallVectorBase<const AssertionPortSymbol*>& results) {
    auto& comp = scope.getCompilation();
    auto parentKind = scope.asSymbol().kind;
    auto& untyped = comp.getType(SyntaxKind::Untyped);
    const DataTypeSyntax* lastType = nullptr;
    std::optional<ArgumentDirection> lastDir;

    for (auto item : syntax.ports) {
        if (item->previewNode)
            scope.addMembers(*item->previewNode);

        auto port = comp.emplace<AssertionPortSymbol>(item->name.valueText(),
                                                      item->name.location());
        port->setSyntax(*item);
        port->setAttributes(scope, item->attributes);

        if (!item->dimensions.empty())
            port->declaredType.setDimensionSyntax(item->dimensions);

        if (item->local) {
            port->direction = item->direction ? SemanticFacts::getDirection(item->direction.kind)
                                              : ArgumentDirection::In;

            // If we have a direction we can never inherit the previous type.
            lastType = nullptr;
        }
        else if (isEmptyType(*item->type)) {
            port->direction = lastDir;
        }

        // 'local' direction requires that we have a sequence type. This flag needs to be
        // added prior to setting a resolved type in the branches below.
        if (port->direction)
            port->declaredType.addFlags(DeclaredTypeFlags::RequireSequenceType);

        if (isEmptyType(*item->type)) {
            if (lastType)
                port->declaredType.setTypeSyntax(*lastType);
            else {
                port->declaredType.setType(untyped);
                if (!item->dimensions.empty()) {
                    scope.addDiag(diag::InvalidArrayElemType, item->dimensions.sourceRange())
                        << untyped;
                }

                if (item->local && parentKind != SymbolKind::LetDecl)
                    scope.addDiag(diag::LocalVarTypeRequired, item->local.range());
            }
        }
        else {
            port->declaredType.setTypeSyntax(*item->type);
            lastType = item->type;

            // Ports of type 'property' are not allowed in sequences,
            // and let declarations cannot have ports of type 'sequence' or 'property'.
            auto itemKind = item->type->kind;
            if (itemKind == SyntaxKind::PropertyType && parentKind == SymbolKind::Sequence) {
                scope.addDiag(diag::PropertyPortInSeq, item->type->sourceRange());
            }
            else if ((itemKind == SyntaxKind::PropertyType ||
                      itemKind == SyntaxKind::SequenceType) &&
                     parentKind == SymbolKind::LetDecl) {
                scope.addDiag(diag::PropertyPortInLet, item->type->sourceRange())
                    << item->type->getFirstToken().valueText();
            }
        }

        lastDir = port->direction;
        if (item->defaultValue) {
            if (port->direction == ArgumentDirection::Out ||
                port->direction == ArgumentDirection::InOut) {
                scope.addDiag(diag::AssertionPortOutputDefault,
                              item->defaultValue->expr->sourceRange());
            }
            else {
                port->defaultValueSyntax = item->defaultValue->expr;
            }
        }

        scope.addMember(*port);
        results.push_back(port);
    }
}